

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

Vec_Bit_t * Gia_ManGenUsed(Gia_Man_t *p,int fBuf)

{
  Vec_Bit_t *p_00;
  int *__s;
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t __size;
  
  uVar3 = p->nObjs;
  iVar5 = (((int)uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
  p_00 = (Vec_Bit_t *)malloc(0x10);
  p_00->nCap = iVar5 * 0x20;
  iVar4 = 0;
  if (iVar5 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar5 << 2;
    __s = (int *)malloc(__size);
  }
  p_00->pArray = __s;
  p_00->nSize = iVar5 * 0x20;
  memset(__s,0,__size);
  for (; iVar4 < (int)uVar3; iVar4 = iVar4 + 1) {
    pGVar1 = Gia_ManObj(p,iVar4);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    uVar2 = *(ulong *)pGVar1;
    if ((~(uint)uVar2 & 0x1fffffff) != 0 && -1 < (int)(uint)uVar2) {
      if (fBuf != 0) {
        Vec_BitWriteEntry(p_00,iVar4,1);
        uVar2 = *(ulong *)pGVar1;
      }
      if (((uint)(uVar2 >> 0x1d) & 1) != fBuf) {
        Vec_BitWriteEntry(p_00,iVar4 - ((uint)uVar2 & 0x1fffffff),1);
        uVar2 = *(ulong *)pGVar1;
      }
      uVar3 = (uint)(uVar2 >> 0x20);
      if ((uVar3 >> 0x1d & 1) != fBuf) {
        Vec_BitWriteEntry(p_00,iVar4 - (uVar3 & 0x1fffffff),1);
      }
    }
    uVar3 = p->nObjs;
  }
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pGVar1 = Gia_ManCo(p,iVar4);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    if ((*(uint *)pGVar1 >> 0x1d & 1) != fBuf) {
      iVar5 = Gia_ObjFaninId0p(p,pGVar1);
      Vec_BitWriteEntry(p_00,iVar5,1);
    }
  }
  Vec_BitWriteEntry(p_00,0,0);
  return p_00;
}

Assistant:

Vec_Bit_t * Gia_ManGenUsed( Gia_Man_t * p, int fBuf )
{
    Gia_Obj_t * pObj; int i;
    Vec_Bit_t * vUsed = Vec_BitStart( Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( fBuf )
            Vec_BitWriteEntry( vUsed, i, 1 );
        if ( Gia_ObjFaninC0(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0(pObj, i), 1 );
        if ( Gia_ObjFaninC1(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId1(pObj, i), 1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        if ( Gia_ObjFaninC0(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0p(p, pObj), 1 );
    Vec_BitWriteEntry( vUsed, 0, 0 ); // clean zero
    return vUsed;
}